

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

void __thiscall
nivalis::anon_unknown_3::Differentiator::Differentiator
          (Differentiator *this,AST *ast,uint64_t var_addr,Environment *env,
          vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *out)

{
  const_reference pvVar1;
  undefined8 in_RDX;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  value_type *__x;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  Environment *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  
  *in_RDI = in_RSI;
  pvVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                     (in_RSI,0);
  in_RDI[1] = pvVar1;
  in_RDI[2] = in_RDX;
  std::
  vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
            *)0x14b7b6);
  Environment::Environment
            ((Environment *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  in_RDI[0x22] = in_R8;
  __x = (value_type *)(in_RDI + 0x23);
  std::
  unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
  ::unordered_set((unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
                   *)0x14b7f2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14b808);
  std::
  unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
  ::insert((unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
            *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),__x);
  return;
}

Assistant:

Differentiator(const Expr::AST& ast, uint64_t var_addr,
            Environment& env, std::vector<Expr::ASTNode>& out)
        : nodes(ast), ast_root(&ast[0]), var_addr(var_addr), env(env), out(out) {
        vis_asts.insert(ast_root);
    }